

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

void __thiscall
lossless_neural_sound::expression_compiler::expression::Product::write_code
          (Product *this,ostream *os,Code_writing_state *state)

{
  Expression_node *pEVar1;
  State *this_00;
  ostream *poVar2;
  string *psVar3;
  
  this_00 = Expression_node::Code_writing_state::get_state(state,(Expression_node *)this);
  if (this_00->written != false) {
    return;
  }
  this_00->written = true;
  pEVar1 = (this->
           super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
           left_node;
  (*(pEVar1->super_Node)._vptr_Node[8])(pEVar1,os,state);
  pEVar1 = (this->
           super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>).
           right_node;
  (*(pEVar1->super_Node)._vptr_Node[8])(pEVar1,os,state);
  poVar2 = std::operator<<(os,(string *)&(state->options).indent);
  poVar2 = std::operator<<(poVar2,(string *)state);
  poVar2 = std::operator<<(poVar2," ");
  psVar3 = Expression_node::Code_writing_state::State::get_variable_name_abi_cxx11_
                     (this_00,(Expression_node *)this,state);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2," = ");
  psVar3 = Expression_node::Code_writing_state::get_variable_name_abi_cxx11_
                     (state,(this->
                            super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
                            ).left_node);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2," * ");
  psVar3 = Expression_node::Code_writing_state::get_variable_name_abi_cxx11_
                     (state,(this->
                            super_Balanced_tree<lossless_neural_sound::expression_compiler::expression::Product>
                            ).right_node);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  std::operator<<(poVar2,";\n");
  return;
}

Assistant:

virtual void write_code(std::ostream &os, Code_writing_state &state) const override
    {
        auto &node_state = state.get_state(this);
        if(node_state.written)
            return;
        node_state.written = true;
        left_node->write_code(os, state);
        right_node->write_code(os, state);
        os << state.options.indent << state.options.value_type << " "
           << node_state.get_variable_name(this, state) << " = "
           << state.get_variable_name(left_node) << " * " << state.get_variable_name(right_node)
           << ";\n";
    }